

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVirtualProtocol.h
# Opt level: O3

uint32_t __thiscall
duckdb_apache::thrift::protocol::
TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
::readBool_virt(TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
                *this,reference value)

{
  uint32_t uVar1;
  ulong uVar2;
  ulong *puVar3;
  bool b;
  bool local_19;
  
  puVar3 = value._M_p;
  local_19 = false;
  uVar1 = TCompactProtocolT<duckdb::ThriftFileTransport>::readBool
                    ((TCompactProtocolT<duckdb::ThriftFileTransport> *)this,&local_19);
  if (local_19 == true) {
    uVar2 = value._M_mask | *puVar3;
  }
  else {
    uVar2 = ~value._M_mask & *puVar3;
  }
  *puVar3 = uVar2;
  return uVar1;
}

Assistant:

uint32_t readBool_virt(duckdb::vector<bool>::reference value) override {
    return static_cast<Protocol_*>(this)->readBool(value);
  }